

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O1

void __thiscall efsw::DirWatcherGeneric::watchDir(DirWatcherGeneric *this,string *dir)

{
  bool bVar1;
  pointer pcVar2;
  string *psVar3;
  bool *pbVar4;
  DirWatcherGeneric *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_60;
  string local_40;
  
  pbVar4 = FileWatcher::allowOutOfScopeLinks(this->Watch->WatcherImpl->mFileWatcher);
  bVar1 = *pbVar4;
  if (bVar1 == true) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    pcVar2 = (dir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar2,pcVar2 + dir->_M_string_length);
    this_00 = findDirWatcher(this,&local_40);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    pcVar2 = (dir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + dir->_M_string_length);
    this_00 = findDirWatcherFast(this,&local_60);
  }
  if (bVar1 == false) {
    psVar3 = &local_60;
  }
  else {
    psVar3 = &local_40;
  }
  paVar5 = &psVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar5->_M_allocated_capacity)[-2] != paVar5) {
    operator_delete((undefined1 *)(&paVar5->_M_allocated_capacity)[-2],
                    paVar5->_M_allocated_capacity + 1);
  }
  if (this_00 != (DirWatcherGeneric *)0x0) {
    watch(this_00,true);
  }
  return;
}

Assistant:

void DirWatcherGeneric::watchDir( std::string &dir )
{
	DirWatcherGeneric * watcher = Watch->WatcherImpl->mFileWatcher->allowOutOfScopeLinks() ?
									findDirWatcher( dir ) :
									findDirWatcherFast( dir );

	if ( NULL != watcher )
	{
		watcher->watch( true );
	}
}